

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrdb.cpp
# Opt level: O0

vector<CAddress,_std::allocator<CAddress>_> * ReadAnchors(path *anchors_db_path)

{
  long lVar1;
  ConstevalFormatString<2U> fmt;
  path *in_RSI;
  path *in_RDI;
  long in_FS_OFFSET;
  Level in_stack_00000060;
  exception *anon_var_0;
  unsigned_long *in_stack_00000070;
  _Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
  *in_stack_00000078;
  vector<CAddress,_std::allocator<CAddress>_> *anchors;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffffebc;
  path *in_stack_fffffffffffffec0;
  string *in_stack_fffffffffffffec8;
  char *in_stack_fffffffffffffed0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffed8;
  path *in_stack_fffffffffffffee8;
  ParamsWrapper<CAddress::SerParams,_std::vector<CAddress,_std::allocator<CAddress>_>_>
  *in_stack_fffffffffffffef0;
  LogFlags in_stack_ffffffffffffff20;
  int source_line;
  string_view in_stack_ffffffffffffff70;
  string_view in_stack_ffffffffffffff80;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)
             CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  CAddress::SerParams::operator()
            ((SerParams *)in_stack_fffffffffffffec8,
             (vector<CAddress,_std::allocator<CAddress>_> *)in_stack_fffffffffffffec0);
  (anonymous_namespace)::
  DeserializeFileDB<ParamsWrapper<CAddress::SerParams,std::vector<CAddress,std::allocator<CAddress>>>>
            (in_RDI,in_stack_fffffffffffffef0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  source_line = 0;
  fmt.fmt = (char *)std::vector<CAddress,_std::allocator<CAddress>_>::size
                              ((vector<CAddress,_std::allocator<CAddress>_> *)
                               CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  fs::path::filename(in_stack_fffffffffffffee8);
  fs::PathToString_abi_cxx11_(in_stack_fffffffffffffec0);
  fs::quoted(in_stack_fffffffffffffec8);
  uVar2 = 2;
  LogPrintFormatInternal<unsigned_long,std::__detail::_Quoted_string<std::__cxx11::string_const&,char>>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff70,source_line,
             in_stack_ffffffffffffff20,in_stack_00000060,fmt,in_stack_00000070,in_stack_00000078);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffebc,uVar2));
  fs::path::~path((path *)CONCAT44(in_stack_fffffffffffffebc,uVar2));
  std::filesystem::remove(in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (vector<CAddress,_std::allocator<CAddress>_> *)in_RDI;
}

Assistant:

std::vector<CAddress> ReadAnchors(const fs::path& anchors_db_path)
{
    std::vector<CAddress> anchors;
    try {
        DeserializeFileDB(anchors_db_path, CAddress::V2_DISK(anchors));
        LogPrintf("Loaded %i addresses from %s\n", anchors.size(), fs::quoted(fs::PathToString(anchors_db_path.filename())));
    } catch (const std::exception&) {
        anchors.clear();
    }

    fs::remove(anchors_db_path);
    return anchors;
}